

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseKernel.hh
# Opt level: O3

void __thiscall
OpenMesh::BaseKernel::copy_all_properties
          (BaseKernel *this,EdgeHandle _eh_from,EdgeHandle _eh_to,bool _copyBuildIn)

{
  int iVar1;
  BaseProperty *pBVar2;
  pointer ppBVar3;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  long local_38;
  
  ppBVar3 = (this->eprops_).properties_.
            super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppBVar3 !=
      (this->eprops_).properties_.
      super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_38 = (long)(int)_eh_from.super_BaseHandle.idx_;
    do {
      pBVar2 = *ppBVar3;
      if (pBVar2 == (BaseProperty *)0x0 || _copyBuildIn) {
        if (pBVar2 != (BaseProperty *)0x0) {
LAB_0019204f:
          (*pBVar2->_vptr_BaseProperty[7])(pBVar2,local_38,(long)(int)_eh_to.super_BaseHandle.idx_);
        }
      }
      else {
        std::__cxx11::string::substr((ulong)local_58,(ulong)&pBVar2->name_);
        iVar1 = std::__cxx11::string::compare((char *)local_58);
        if (local_58[0] != local_48) {
          operator_delete(local_58[0]);
        }
        if (iVar1 != 0) {
          pBVar2 = *ppBVar3;
          goto LAB_0019204f;
        }
      }
      ppBVar3 = ppBVar3 + 1;
    } while (ppBVar3 !=
             (this->eprops_).properties_.
             super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

void copy_all_properties(EdgeHandle _eh_from, EdgeHandle _eh_to, bool _copyBuildIn = false) {
    for( PropertyContainer::iterator p_it = eprops_.begin();
        p_it != eprops_.end(); ++p_it) {

      // Copy all properties, if build in is true
      // Otherwise, copy only properties without build in specifier
      if ( *p_it && ( _copyBuildIn || (*p_it)->name().substr(0,2) != "e:") )
        (*p_it)->copy(_eh_from.idx(), _eh_to.idx());

    }
  }